

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UBool __thiscall icu_63::UnicodeSet::containsAll(UnicodeSet *this,UnicodeString *s)

{
  int32_t iVar1;
  int32_t iVar2;
  char16_t *s_00;
  UnicodeString *s_local;
  UnicodeSet *this_local;
  
  s_00 = icu_63::UnicodeString::getBuffer(s);
  iVar1 = icu_63::UnicodeString::length(s);
  iVar1 = span(this,s_00,iVar1,USET_SPAN_CONTAINED);
  iVar2 = icu_63::UnicodeString::length(s);
  return iVar1 == iVar2;
}

Assistant:

UBool UnicodeSet::containsAll(const UnicodeString& s) const {
    return (UBool)(span(s.getBuffer(), s.length(), USET_SPAN_CONTAINED) ==
                   s.length());
}